

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool __thiscall
ByteCodeGenerator::NeedScopeObjectForArguments
          (ByteCodeGenerator *this,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((*(uint *)&funcInfo->field_0xb4 & 0x10) != 0) &&
      (((((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0 ||
        ((pnodeFnc->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone)) &&
       ((this->flags & 0x404) == 0)))) && ((funcInfo->paramScope->field_0x44 & 2) == 0)) {
    bVar1 = (bool)((funcInfo->bodyScope->field_0x44 & 2) >> 1);
  }
  if (((*(uint *)&funcInfo->field_0xb4 & 0x10) == 0) ||
     ((pnodeFnc->pnodeParams == (ParseNodePtr)0x0 && (pnodeFnc->pnodeRest == (ParseNodePtr)0x0)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeGenerator::NeedScopeObjectForArguments(FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc) const
{
    // We can avoid creating a scope object with arguments present if:
    bool dontNeedScopeObject =
        // We have arguments, and
        funcInfo->GetHasHeapArguments()
        // Either we are in strict mode, or have strict mode formal semantics from a non-simple parameter list, and
        && (funcInfo->GetIsStrictMode()
            || pnodeFnc->HasNonSimpleParameterList())
        // We're not in eval or event handler, which will force the scope(s) to be objects
        && !(this->flags & (fscrEval | fscrImplicitThis))
        // Neither of the scopes are objects
        && !funcInfo->paramScope->GetIsObject()
        && !funcInfo->bodyScope->GetIsObject();

    return funcInfo->GetHasHeapArguments()
        // Regardless of the conditions above, we won't need a scope object if there aren't any formals.
        && (pnodeFnc->pnodeParams != nullptr || pnodeFnc->pnodeRest != nullptr)
        && !dontNeedScopeObject;
}